

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

double __thiscall Function::getYInput(Function *this)

{
  Function *extraout_XMM0_Qa;
  Function *this_local;
  
  if (this->eType == INPUT_Y) {
    (*(this->super_Physical)._vptr_Physical[0xc])();
    this_local = extraout_XMM0_Qa;
  }
  else if (this->xLeft == (Function *)0x0) {
    if (this->xRight == (Function *)0x0) {
      if (this->xPlus == (Function *)0x0) {
        this_local = (Function *)0x0;
      }
      else {
        this_local = (Function *)getYInput(this->xPlus);
      }
    }
    else {
      this_local = (Function *)getYInput(this->xRight);
    }
  }
  else {
    this_local = (Function *)getYInput(this->xLeft);
  }
  return (double)this_local;
}

Assistant:

double Function::getYInput()
{
	if (eType==INPUT_Y) {
		return getValue();
	}
	if (xLeft) return xLeft->getYInput();
	if (xRight) return xRight->getYInput();
	if (xPlus) return xPlus->getYInput();
	
	return 0.0;
}